

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFIn.cpp
# Opt level: O0

void __thiscall NaPNFileInput::set_input_filename(NaPNFileInput *this,char *szFileName)

{
  undefined4 *puVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RSI;
  long in_RDI;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x14c9cd);
  if (in_RSI == (char *)0x0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  if (*(void **)(in_RDI + 200) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 200));
  }
  *(undefined8 *)(in_RDI + 200) = 0;
  sVar2 = strlen(in_RSI);
  pvVar3 = operator_new__(sVar2 + 1);
  *(void **)(in_RDI + 200) = pvVar3;
  strcpy(*(char **)(in_RDI + 200),in_RSI);
  return;
}

Assistant:

void
NaPNFileInput::set_input_filename (const char* szFileName)
{
    check_tunable();

    if(NULL == szFileName)
        throw(na_null_pointer);

    delete[] szDataFName;  szDataFName = NULL;

    szDataFName = new char[strlen(szFileName) + 1];
    strcpy(szDataFName, szFileName);
}